

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFastFieldEntries
          (ParseFunctionGenerator *this,Formatter *format)

{
  char cVar1;
  TailCallTableInfo *pTVar2;
  pointer pFVar3;
  bool bVar4;
  FileOptions_OptimizeMode FVar5;
  size_type sVar6;
  AlphaNum *b;
  char *pcVar7;
  TcParseFunction func;
  int line;
  string *this_00;
  unsigned_short *args_1;
  undefined1 split;
  string_view suffix;
  string_view suffix_00;
  string_view suffix_01;
  string_view suffix_02;
  string_view suffix_03;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string func_name;
  string local_1a0;
  string field_type;
  string local_160;
  undefined1 local_130 [32];
  AlphaNum local_110;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  pTVar2 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  pFVar3 = *(pointer *)
            ((long)&(pTVar2->fast_path_fields).
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
            + 8);
  args_1 = (unsigned_short *)
           (*(long *)&(pTVar2->fast_path_fields).
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                      ._M_impl + 0x10);
  do {
    if ((pointer)(args_1 + -8) == pFVar3) {
      return;
    }
    cVar1 = (char)args_1[4];
    if (args_1 == (unsigned_short *)&DAT_00000010 || cVar1 != '\x02') {
      split = args_1 == (unsigned_short *)&DAT_00000010;
      if (cVar1 == '\x01' && !(bool)split) {
        PrintFieldComment<google::protobuf::FieldDescriptor>
                  (format,*(FieldDescriptor **)(args_1 + -4),this->options_);
        bVar4 = ShouldSplit(*(FieldDescriptor **)(args_1 + -4),this->options_);
        if (bVar4) {
          pcVar7 = "!ShouldSplit(as_field->field, options_)";
          line = 0x260;
          goto LAB_00b311dc;
        }
        TcParseFunctionName_abi_cxx11_(&func_name,(cpp *)(ulong)(byte)args_1[-8],func);
        FVar5 = GetOptimizeFor(*(FileDescriptor **)(*(long *)(args_1 + -4) + 0x10),this->options_);
        if (FVar5 == FileOptions_OptimizeMode_SPEED) {
          suffix._M_str = "V8S1";
          suffix._M_len = 4;
          text._M_str = func_name._M_dataplus._M_p;
          text._M_len = func_name._M_string_length;
          bVar4 = absl::lts_20250127::EndsWith(text,suffix);
          if (!bVar4) {
            suffix_00._M_str = "V32S1";
            suffix_00._M_len = 5;
            text_00._M_str = func_name._M_dataplus._M_p;
            text_00._M_len = func_name._M_string_length;
            bVar4 = absl::lts_20250127::EndsWith(text_00,suffix_00);
            if (!bVar4) {
              suffix_01._M_str = "V64S1";
              suffix_01._M_len = 5;
              split = 0x4d;
              text_01._M_str = func_name._M_dataplus._M_p;
              text_01._M_len = func_name._M_string_length;
              bVar4 = absl::lts_20250127::EndsWith(text_01,suffix_01);
              if (!bVar4) goto LAB_00b31142;
            }
          }
          suffix_02._M_str = "V8S1";
          suffix_02._M_len = 4;
          text_02._M_str = func_name._M_dataplus._M_p;
          text_02._M_len = func_name._M_string_length;
          bVar4 = absl::lts_20250127::EndsWith(text_02,suffix_02);
          pcVar7 = "bool";
          if (!bVar4) {
            suffix_03._M_str = "V32S1";
            suffix_03._M_len = 5;
            text_03._M_str = func_name._M_dataplus._M_p;
            text_03._M_len = func_name._M_string_length;
            bVar4 = absl::lts_20250127::EndsWith(text_03,suffix_03);
            pcVar7 = "::uint64_t";
            if (bVar4) {
              pcVar7 = "::uint32_t";
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&field_type,pcVar7,(allocator<char> *)&local_160);
          local_160._0_16_ =
               absl::lts_20250127::NullSafeStringView("::_pbi::TcParser::SingularVarintNoZag1<");
          local_80.piece_._M_len = field_type._M_string_length;
          local_80.piece_._M_str = field_type._M_dataplus._M_p;
          local_b0.piece_ = absl::lts_20250127::NullSafeStringView(", offsetof(");
          ClassName_abi_cxx11_
                    (&local_1a0,*(cpp **)(*(long *)(args_1 + -4) + 0x20),
                     (Descriptor *)local_b0.piece_._M_str);
          local_e0.piece_._M_len = local_1a0._M_string_length;
          local_e0.piece_._M_str = local_1a0._M_dataplus._M_p;
          sVar6 = local_1a0._M_string_length;
          local_110.piece_ = absl::lts_20250127::NullSafeStringView(", ");
          FieldMemberName_abi_cxx11_
                    ((string *)local_130,*(cpp **)(args_1 + -4),(FieldDescriptor *)0x0,
                     SUB81(sVar6,0));
          b = &local_b0;
          absl::lts_20250127::StrCat<std::__cxx11::string,char[4],unsigned_char,char[4]>
                    (&local_50,(lts_20250127 *)&local_160,&local_80,b,&local_e0,&local_110,
                     (AlphaNum *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfe0337,
                     (char (*) [4])(args_1 + 1),">()",(char (*) [4])func_name._M_dataplus._M_p);
          split = SUB81(b,0);
          std::__cxx11::string::operator=((string *)&func_name,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&field_type);
        }
LAB_00b31142:
        FieldMemberName_abi_cxx11_
                  (&local_160,*(cpp **)(args_1 + -4),(FieldDescriptor *)0x0,(bool)split);
        Formatter::operator()
                  (format,"{$1$,\n {$2$, $3$, $4$, PROTOBUF_FIELD_OFFSET($classname$, $5$)}},\n",
                   &func_name,args_1,(uchar *)(args_1 + 1),(uchar *)((long)args_1 + 3),&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        this_00 = &func_name;
        goto LAB_00b31184;
      }
      if (cVar1 != '\0') {
        pcVar7 = "info.is_empty()";
        line = 0x280;
LAB_00b311dc:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_160,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
                   ,line,pcVar7);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_160);
      }
      Formatter::operator()<>(format,"{::_pbi::TcParser::MiniParse, {}},\n");
    }
    else {
      TcParseFunctionName_abi_cxx11_(&local_160,(cpp *)(ulong)(byte)args_1[-8],cVar1 != '\x02');
      Formatter::operator()(format,"{$1$, {$2$, $3$}},\n",&local_160,args_1 + -7,args_1 + -6);
      this_00 = &local_160;
LAB_00b31184:
      std::__cxx11::string::~string((string *)this_00);
    }
    args_1 = args_1 + 0x10;
  } while( true );
}

Assistant:

void ParseFunctionGenerator::GenerateFastFieldEntries(Formatter& format) {
  for (const auto& info : tc_table_info_->fast_path_fields) {
    if (auto* nonfield = info.AsNonField()) {
      // Fast slot that is not associated with a field. Eg end group tags.
      format("{$1$, {$2$, $3$}},\n", TcParseFunctionName(nonfield->func),
             nonfield->coded_tag, nonfield->nonfield_info);
    } else if (auto* as_field = info.AsField()) {
      PrintFieldComment(format, as_field->field, options_);
      ABSL_CHECK(!ShouldSplit(as_field->field, options_));

      std::string func_name = TcParseFunctionName(as_field->func);
      if (GetOptimizeFor(as_field->field->file(), options_) ==
          FileOptions::SPEED) {
        // For 1-byte tags we have a more optimized version of the varint parser
        // that can hardcode the offset and has bit.
        if (absl::EndsWith(func_name, "V8S1") ||
            absl::EndsWith(func_name, "V32S1") ||
            absl::EndsWith(func_name, "V64S1")) {
          std::string field_type = absl::EndsWith(func_name, "V8S1") ? "bool"
                                   : absl::EndsWith(func_name, "V32S1")
                                       ? "::uint32_t"
                                       : "::uint64_t";
          func_name = absl::StrCat(
              "::_pbi::TcParser::SingularVarintNoZag1<", field_type,
              ", offsetof(",                                      //
              ClassName(as_field->field->containing_type()),      //
              ", ",                                               //
              FieldMemberName(as_field->field, /*split=*/false),  //
              "), ",                                              //
              as_field->hasbit_idx,                               //
              ">()");
        }
      }

      format(
          "{$1$,\n"
          " {$2$, $3$, $4$, PROTOBUF_FIELD_OFFSET($classname$, $5$)}},\n",
          func_name, as_field->coded_tag, as_field->hasbit_idx,
          as_field->aux_idx, FieldMemberName(as_field->field, /*split=*/false));
    } else {
      ABSL_DCHECK(info.is_empty());
      format("{::_pbi::TcParser::MiniParse, {}},\n");
    }
  }
}